

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_ref_t *
flatcc_builder_offset_vector_push(flatcc_builder_t *B,flatcc_builder_ref_t ref)

{
  flatcc_builder_ref_t *p;
  flatcc_builder_ref_t ref_local;
  flatcc_builder_t *B_local;
  
  if (B->frame->type == 5) {
    if ((B->frame->container).table.pl_end == 0x3fffffff) {
      B_local = (flatcc_builder_t *)0x0;
    }
    else {
      (B->frame->container).table.pl_end = (B->frame->container).table.pl_end + 1;
      B_local = (flatcc_builder_t *)push_ds(B,4);
      if (B_local == (flatcc_builder_t *)0x0) {
        B_local = (flatcc_builder_t *)0x0;
      }
      else {
        *(flatcc_builder_ref_t *)&B_local->pl = ref;
      }
    }
    return (flatcc_builder_ref_t *)B_local;
  }
  __assert_fail("(B->frame[0].type) == flatcc_builder_offset_vector",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x3bb,
                "flatcc_builder_ref_t *flatcc_builder_offset_vector_push(flatcc_builder_t *, flatcc_builder_ref_t)"
               );
}

Assistant:

flatcc_builder_ref_t *flatcc_builder_offset_vector_push(flatcc_builder_t *B, flatcc_builder_ref_t ref)
{
    flatcc_builder_ref_t *p;

    check(frame(type) == flatcc_builder_offset_vector, "expected offset vector frame");
    if (frame(container.vector.count) == max_offset_count) {
        return 0;
    }
    frame(container.vector.count) += 1;
    if (0 == (p = push_ds(B, field_size))) {
        return 0;
    }
    *p = ref;
    return p;
}